

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceBound::~IfcFaceBound(IfcFaceBound *this)

{
  ~IfcFaceBound((IfcFaceBound *)((long)&this[-1].Orientation.field_2 + 8));
  return;
}

Assistant:

IfcFaceBound() : Object("IfcFaceBound") {}